

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_ringbuffer.h
# Opt level: O3

int __thiscall
ring_buffer_base<cubeb_log_message>::enqueue
          (ring_buffer_base<cubeb_log_message> *this,cubeb_log_message *elements,int count)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  ulong uVar50;
  cubeb_log_message *pcVar51;
  long lVar52;
  long lVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  long lVar57;
  int iVar78;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  int iVar79;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  int iVar141;
  int iVar142;
  int iVar149;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  int iVar150;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  
  auVar49 = _DAT_00146060;
  iVar78 = (this->read_index_).super___atomic_base<int>._M_i;
  uVar1 = (this->write_index_).super___atomic_base<int>._M_i;
  iVar56 = this->capacity_;
  iVar55 = 0;
  if ((int)(uVar1 + 1) % iVar56 != iVar78) {
    iVar55 = 0;
    if (iVar78 <= (int)uVar1) {
      iVar55 = iVar56;
    }
    iVar55 = iVar55 + ~uVar1 + iVar78;
    if (count <= iVar55) {
      iVar55 = count;
    }
    iVar56 = iVar56 - uVar1;
    iVar78 = iVar56;
    if (iVar55 < iVar56) {
      iVar78 = iVar55;
    }
    iVar54 = iVar55 - iVar78;
    pcVar51 = (this->data_)._M_t.
              super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>.
              _M_t.
              super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>
              .super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl;
    lVar53 = (long)iVar78;
    if (elements == (cubeb_log_message *)0x0) {
      if (iVar78 != 0) {
        uVar50 = lVar53 + 0xfU & 0xfffffffffffffff0;
        lVar53 = lVar53 + -1;
        auVar58._8_4_ = (int)lVar53;
        auVar58._0_8_ = lVar53;
        auVar58._12_4_ = (int)((ulong)lVar53 >> 0x20);
        pcVar51 = pcVar51 + (long)(int)uVar1 + 0xf;
        auVar59 = auVar58;
        auVar113 = _DAT_00147180;
        auVar128 = _DAT_00147190;
        auVar82 = _DAT_001471a0;
        auVar84 = _DAT_001471b0;
        auVar86 = _DAT_001471c0;
        auVar88 = _DAT_001471d0;
        auVar90 = _DAT_00146080;
        auVar92 = _DAT_00146050;
        do {
          auVar111 = auVar58 ^ auVar49;
          auVar115 = auVar92 ^ auVar49;
          iVar78 = auVar111._0_4_;
          iVar141 = -(uint)(iVar78 < auVar115._0_4_);
          iVar79 = auVar111._4_4_;
          auVar117._4_4_ = -(uint)(iVar79 < auVar115._4_4_);
          iVar142 = auVar111._8_4_;
          iVar149 = -(uint)(iVar142 < auVar115._8_4_);
          iVar150 = auVar111._12_4_;
          auVar117._12_4_ = -(uint)(iVar150 < auVar115._12_4_);
          auVar111._4_4_ = iVar141;
          auVar111._0_4_ = iVar141;
          auVar111._8_4_ = iVar149;
          auVar111._12_4_ = iVar149;
          auVar111 = pshuflw(auVar59,auVar111,0xe8);
          auVar116._4_4_ = -(uint)(auVar115._4_4_ == iVar79);
          auVar116._12_4_ = -(uint)(auVar115._12_4_ == iVar150);
          auVar116._0_4_ = auVar116._4_4_;
          auVar116._8_4_ = auVar116._12_4_;
          auVar94 = pshuflw(in_XMM11,auVar116,0xe8);
          auVar117._0_4_ = auVar117._4_4_;
          auVar117._8_4_ = auVar117._12_4_;
          auVar115 = pshuflw(auVar111,auVar117,0xe8);
          auVar59._8_4_ = 0xffffffff;
          auVar59._0_8_ = 0xffffffffffffffff;
          auVar59._12_4_ = 0xffffffff;
          auVar59 = (auVar115 | auVar94 & auVar111) ^ auVar59;
          auVar59 = packssdw(auVar59,auVar59);
          if ((auVar59 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pcVar51[-0xf].storage[0] = '\0';
          }
          auVar94._4_4_ = iVar141;
          auVar94._0_4_ = iVar141;
          auVar94._8_4_ = iVar149;
          auVar94._12_4_ = iVar149;
          auVar117 = auVar116 & auVar94 | auVar117;
          auVar59 = packssdw(auVar117,auVar117);
          auVar115._8_4_ = 0xffffffff;
          auVar115._0_8_ = 0xffffffffffffffff;
          auVar115._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 ^ auVar115,auVar59 ^ auVar115);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59._0_4_ >> 8 & 1) != 0) {
            pcVar51[-0xe].storage[0] = '\0';
          }
          auVar59 = auVar90 ^ auVar49;
          auVar95._0_4_ = -(uint)(iVar78 < auVar59._0_4_);
          auVar95._4_4_ = -(uint)(iVar79 < auVar59._4_4_);
          auVar95._8_4_ = -(uint)(iVar142 < auVar59._8_4_);
          auVar95._12_4_ = -(uint)(iVar150 < auVar59._12_4_);
          auVar118._4_4_ = auVar95._0_4_;
          auVar118._0_4_ = auVar95._0_4_;
          auVar118._8_4_ = auVar95._8_4_;
          auVar118._12_4_ = auVar95._8_4_;
          iVar141 = -(uint)(auVar59._4_4_ == iVar79);
          iVar149 = -(uint)(auVar59._12_4_ == iVar150);
          auVar21._4_4_ = iVar141;
          auVar21._0_4_ = iVar141;
          auVar21._8_4_ = iVar149;
          auVar21._12_4_ = iVar149;
          auVar143._4_4_ = auVar95._4_4_;
          auVar143._0_4_ = auVar95._4_4_;
          auVar143._8_4_ = auVar95._12_4_;
          auVar143._12_4_ = auVar95._12_4_;
          auVar59 = auVar21 & auVar118 | auVar143;
          auVar59 = packssdw(auVar59,auVar59);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 ^ auVar2,auVar59 ^ auVar2);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59._0_4_ >> 0x10 & 1) != 0) {
            pcVar51[-0xd].storage[0] = '\0';
          }
          auVar59 = pshufhw(auVar59,auVar118,0x84);
          auVar22._4_4_ = iVar141;
          auVar22._0_4_ = iVar141;
          auVar22._8_4_ = iVar149;
          auVar22._12_4_ = iVar149;
          auVar115 = pshufhw(auVar95,auVar22,0x84);
          auVar111 = pshufhw(auVar59,auVar143,0x84);
          auVar60._8_4_ = 0xffffffff;
          auVar60._0_8_ = 0xffffffffffffffff;
          auVar60._12_4_ = 0xffffffff;
          auVar60 = (auVar111 | auVar115 & auVar59) ^ auVar60;
          auVar59 = packssdw(auVar60,auVar60);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59._0_4_ >> 0x18 & 1) != 0) {
            pcVar51[-0xc].storage[0] = '\0';
          }
          auVar59 = auVar88 ^ auVar49;
          auVar96._0_4_ = -(uint)(iVar78 < auVar59._0_4_);
          auVar96._4_4_ = -(uint)(iVar79 < auVar59._4_4_);
          auVar96._8_4_ = -(uint)(iVar142 < auVar59._8_4_);
          auVar96._12_4_ = -(uint)(iVar150 < auVar59._12_4_);
          auVar23._4_4_ = auVar96._0_4_;
          auVar23._0_4_ = auVar96._0_4_;
          auVar23._8_4_ = auVar96._8_4_;
          auVar23._12_4_ = auVar96._8_4_;
          auVar115 = pshuflw(auVar143,auVar23,0xe8);
          auVar61._0_4_ = -(uint)(auVar59._0_4_ == iVar78);
          auVar61._4_4_ = -(uint)(auVar59._4_4_ == iVar79);
          auVar61._8_4_ = -(uint)(auVar59._8_4_ == iVar142);
          auVar61._12_4_ = -(uint)(auVar59._12_4_ == iVar150);
          auVar119._4_4_ = auVar61._4_4_;
          auVar119._0_4_ = auVar61._4_4_;
          auVar119._8_4_ = auVar61._12_4_;
          auVar119._12_4_ = auVar61._12_4_;
          auVar59 = pshuflw(auVar61,auVar119,0xe8);
          auVar120._4_4_ = auVar96._4_4_;
          auVar120._0_4_ = auVar96._4_4_;
          auVar120._8_4_ = auVar96._12_4_;
          auVar120._12_4_ = auVar96._12_4_;
          auVar111 = pshuflw(auVar96,auVar120,0xe8);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 & auVar115,(auVar111 | auVar59 & auVar115) ^ auVar3);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pcVar51[-0xb].storage[0] = '\0';
          }
          auVar24._4_4_ = auVar96._0_4_;
          auVar24._0_4_ = auVar96._0_4_;
          auVar24._8_4_ = auVar96._8_4_;
          auVar24._12_4_ = auVar96._8_4_;
          auVar120 = auVar119 & auVar24 | auVar120;
          auVar111 = packssdw(auVar120,auVar120);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59,auVar111 ^ auVar4);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59._4_2_ >> 8 & 1) != 0) {
            pcVar51[-10].storage[0] = '\0';
          }
          auVar59 = auVar86 ^ auVar49;
          auVar97._0_4_ = -(uint)(iVar78 < auVar59._0_4_);
          auVar97._4_4_ = -(uint)(iVar79 < auVar59._4_4_);
          auVar97._8_4_ = -(uint)(iVar142 < auVar59._8_4_);
          auVar97._12_4_ = -(uint)(iVar150 < auVar59._12_4_);
          auVar121._4_4_ = auVar97._0_4_;
          auVar121._0_4_ = auVar97._0_4_;
          auVar121._8_4_ = auVar97._8_4_;
          auVar121._12_4_ = auVar97._8_4_;
          iVar141 = -(uint)(auVar59._4_4_ == iVar79);
          iVar149 = -(uint)(auVar59._12_4_ == iVar150);
          auVar25._4_4_ = iVar141;
          auVar25._0_4_ = iVar141;
          auVar25._8_4_ = iVar149;
          auVar25._12_4_ = iVar149;
          auVar144._4_4_ = auVar97._4_4_;
          auVar144._0_4_ = auVar97._4_4_;
          auVar144._8_4_ = auVar97._12_4_;
          auVar144._12_4_ = auVar97._12_4_;
          auVar59 = auVar25 & auVar121 | auVar144;
          auVar59 = packssdw(auVar59,auVar59);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 ^ auVar5,auVar59 ^ auVar5);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pcVar51[-9].storage[0] = '\0';
          }
          auVar59 = pshufhw(auVar59,auVar121,0x84);
          auVar26._4_4_ = iVar141;
          auVar26._0_4_ = iVar141;
          auVar26._8_4_ = iVar149;
          auVar26._12_4_ = iVar149;
          auVar115 = pshufhw(auVar97,auVar26,0x84);
          auVar111 = pshufhw(auVar59,auVar144,0x84);
          auVar62._8_4_ = 0xffffffff;
          auVar62._0_8_ = 0xffffffffffffffff;
          auVar62._12_4_ = 0xffffffff;
          auVar62 = (auVar111 | auVar115 & auVar59) ^ auVar62;
          auVar59 = packssdw(auVar62,auVar62);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59._6_2_ >> 8 & 1) != 0) {
            pcVar51[-8].storage[0] = '\0';
          }
          auVar59 = auVar84 ^ auVar49;
          auVar98._0_4_ = -(uint)(iVar78 < auVar59._0_4_);
          auVar98._4_4_ = -(uint)(iVar79 < auVar59._4_4_);
          auVar98._8_4_ = -(uint)(iVar142 < auVar59._8_4_);
          auVar98._12_4_ = -(uint)(iVar150 < auVar59._12_4_);
          auVar27._4_4_ = auVar98._0_4_;
          auVar27._0_4_ = auVar98._0_4_;
          auVar27._8_4_ = auVar98._8_4_;
          auVar27._12_4_ = auVar98._8_4_;
          auVar115 = pshuflw(auVar144,auVar27,0xe8);
          auVar63._0_4_ = -(uint)(auVar59._0_4_ == iVar78);
          auVar63._4_4_ = -(uint)(auVar59._4_4_ == iVar79);
          auVar63._8_4_ = -(uint)(auVar59._8_4_ == iVar142);
          auVar63._12_4_ = -(uint)(auVar59._12_4_ == iVar150);
          auVar122._4_4_ = auVar63._4_4_;
          auVar122._0_4_ = auVar63._4_4_;
          auVar122._8_4_ = auVar63._12_4_;
          auVar122._12_4_ = auVar63._12_4_;
          auVar59 = pshuflw(auVar63,auVar122,0xe8);
          auVar123._4_4_ = auVar98._4_4_;
          auVar123._0_4_ = auVar98._4_4_;
          auVar123._8_4_ = auVar98._12_4_;
          auVar123._12_4_ = auVar98._12_4_;
          auVar111 = pshuflw(auVar98,auVar123,0xe8);
          auVar99._8_4_ = 0xffffffff;
          auVar99._0_8_ = 0xffffffffffffffff;
          auVar99._12_4_ = 0xffffffff;
          auVar99 = (auVar111 | auVar59 & auVar115) ^ auVar99;
          auVar111 = packssdw(auVar99,auVar99);
          auVar59 = packsswb(auVar59 & auVar115,auVar111);
          if ((auVar59 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pcVar51[-7].storage[0] = '\0';
          }
          auVar28._4_4_ = auVar98._0_4_;
          auVar28._0_4_ = auVar98._0_4_;
          auVar28._8_4_ = auVar98._8_4_;
          auVar28._12_4_ = auVar98._8_4_;
          auVar123 = auVar122 & auVar28 | auVar123;
          auVar111 = packssdw(auVar123,auVar123);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar111 = packssdw(auVar111 ^ auVar6,auVar111 ^ auVar6);
          auVar59 = packsswb(auVar59,auVar111);
          if ((auVar59._8_2_ >> 8 & 1) != 0) {
            pcVar51[-6].storage[0] = '\0';
          }
          auVar59 = auVar82 ^ auVar49;
          auVar100._0_4_ = -(uint)(iVar78 < auVar59._0_4_);
          auVar100._4_4_ = -(uint)(iVar79 < auVar59._4_4_);
          auVar100._8_4_ = -(uint)(iVar142 < auVar59._8_4_);
          auVar100._12_4_ = -(uint)(iVar150 < auVar59._12_4_);
          auVar124._4_4_ = auVar100._0_4_;
          auVar124._0_4_ = auVar100._0_4_;
          auVar124._8_4_ = auVar100._8_4_;
          auVar124._12_4_ = auVar100._8_4_;
          iVar141 = -(uint)(auVar59._4_4_ == iVar79);
          iVar149 = -(uint)(auVar59._12_4_ == iVar150);
          auVar29._4_4_ = iVar141;
          auVar29._0_4_ = iVar141;
          auVar29._8_4_ = iVar149;
          auVar29._12_4_ = iVar149;
          auVar145._4_4_ = auVar100._4_4_;
          auVar145._0_4_ = auVar100._4_4_;
          auVar145._8_4_ = auVar100._12_4_;
          auVar145._12_4_ = auVar100._12_4_;
          auVar59 = auVar29 & auVar124 | auVar145;
          auVar59 = packssdw(auVar59,auVar59);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 ^ auVar7,auVar59 ^ auVar7);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            pcVar51[-5].storage[0] = '\0';
          }
          auVar59 = pshufhw(auVar59,auVar124,0x84);
          auVar30._4_4_ = iVar141;
          auVar30._0_4_ = iVar141;
          auVar30._8_4_ = iVar149;
          auVar30._12_4_ = iVar149;
          auVar115 = pshufhw(auVar100,auVar30,0x84);
          auVar111 = pshufhw(auVar59,auVar145,0x84);
          auVar64._8_4_ = 0xffffffff;
          auVar64._0_8_ = 0xffffffffffffffff;
          auVar64._12_4_ = 0xffffffff;
          auVar64 = (auVar111 | auVar115 & auVar59) ^ auVar64;
          auVar59 = packssdw(auVar64,auVar64);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59._10_2_ >> 8 & 1) != 0) {
            pcVar51[-4].storage[0] = '\0';
          }
          auVar59 = auVar128 ^ auVar49;
          auVar101._0_4_ = -(uint)(iVar78 < auVar59._0_4_);
          auVar101._4_4_ = -(uint)(iVar79 < auVar59._4_4_);
          auVar101._8_4_ = -(uint)(iVar142 < auVar59._8_4_);
          auVar101._12_4_ = -(uint)(iVar150 < auVar59._12_4_);
          auVar31._4_4_ = auVar101._0_4_;
          auVar31._0_4_ = auVar101._0_4_;
          auVar31._8_4_ = auVar101._8_4_;
          auVar31._12_4_ = auVar101._8_4_;
          auVar115 = pshuflw(auVar145,auVar31,0xe8);
          auVar65._0_4_ = -(uint)(auVar59._0_4_ == iVar78);
          auVar65._4_4_ = -(uint)(auVar59._4_4_ == iVar79);
          auVar65._8_4_ = -(uint)(auVar59._8_4_ == iVar142);
          auVar65._12_4_ = -(uint)(auVar59._12_4_ == iVar150);
          auVar125._4_4_ = auVar65._4_4_;
          auVar125._0_4_ = auVar65._4_4_;
          auVar125._8_4_ = auVar65._12_4_;
          auVar125._12_4_ = auVar65._12_4_;
          auVar59 = pshuflw(auVar65,auVar125,0xe8);
          auVar126._4_4_ = auVar101._4_4_;
          auVar126._0_4_ = auVar101._4_4_;
          auVar126._8_4_ = auVar101._12_4_;
          auVar126._12_4_ = auVar101._12_4_;
          auVar111 = pshuflw(auVar101,auVar126,0xe8);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 & auVar115,(auVar111 | auVar59 & auVar115) ^ auVar8);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pcVar51[-3].storage[0] = '\0';
          }
          auVar32._4_4_ = auVar101._0_4_;
          auVar32._0_4_ = auVar101._0_4_;
          auVar32._8_4_ = auVar101._8_4_;
          auVar32._12_4_ = auVar101._8_4_;
          auVar126 = auVar125 & auVar32 | auVar126;
          auVar111 = packssdw(auVar126,auVar126);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59,auVar111 ^ auVar9);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59._12_2_ >> 8 & 1) != 0) {
            pcVar51[-2].storage[0] = '\0';
          }
          auVar59 = auVar113 ^ auVar49;
          auVar102._0_4_ = -(uint)(iVar78 < auVar59._0_4_);
          auVar102._4_4_ = -(uint)(iVar79 < auVar59._4_4_);
          auVar102._8_4_ = -(uint)(iVar142 < auVar59._8_4_);
          auVar102._12_4_ = -(uint)(iVar150 < auVar59._12_4_);
          auVar127._4_4_ = auVar102._0_4_;
          auVar127._0_4_ = auVar102._0_4_;
          auVar127._8_4_ = auVar102._8_4_;
          auVar127._12_4_ = auVar102._8_4_;
          iVar78 = -(uint)(auVar59._4_4_ == iVar79);
          iVar79 = -(uint)(auVar59._12_4_ == iVar150);
          auVar112._4_4_ = iVar78;
          auVar112._0_4_ = iVar78;
          auVar112._8_4_ = iVar79;
          auVar112._12_4_ = iVar79;
          auVar66._4_4_ = auVar102._4_4_;
          auVar66._0_4_ = auVar102._4_4_;
          auVar66._8_4_ = auVar102._12_4_;
          auVar66._12_4_ = auVar102._12_4_;
          auVar66 = auVar112 & auVar127 | auVar66;
          auVar59 = packssdw(auVar66,auVar66);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 ^ auVar10,auVar59 ^ auVar10);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pcVar51[-1].storage[0] = '\0';
          }
          auVar59 = pshufhw(auVar59,auVar127,0x84);
          auVar111 = pshufhw(auVar102,auVar112,0x84);
          in_XMM11 = auVar111 & auVar59;
          auVar33._4_4_ = auVar102._4_4_;
          auVar33._0_4_ = auVar102._4_4_;
          auVar33._8_4_ = auVar102._12_4_;
          auVar33._12_4_ = auVar102._12_4_;
          auVar59 = pshufhw(auVar59,auVar33,0x84);
          auVar67._8_4_ = 0xffffffff;
          auVar67._0_8_ = 0xffffffffffffffff;
          auVar67._12_4_ = 0xffffffff;
          auVar67 = (auVar59 | in_XMM11) ^ auVar67;
          auVar59 = packssdw(auVar67,auVar67);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59._14_2_ >> 8 & 1) != 0) {
            pcVar51->storage[0] = '\0';
          }
          lVar53 = (long)DAT_001471f0;
          lVar52 = auVar92._8_8_;
          auVar92._0_8_ = auVar92._0_8_ + lVar53;
          lVar57 = DAT_001471f0._8_8_;
          auVar92._8_8_ = lVar52 + lVar57;
          lVar52 = auVar90._8_8_;
          auVar90._0_8_ = auVar90._0_8_ + lVar53;
          auVar90._8_8_ = lVar52 + lVar57;
          lVar52 = auVar88._8_8_;
          auVar88._0_8_ = auVar88._0_8_ + lVar53;
          auVar88._8_8_ = lVar52 + lVar57;
          lVar52 = auVar86._8_8_;
          auVar86._0_8_ = auVar86._0_8_ + lVar53;
          auVar86._8_8_ = lVar52 + lVar57;
          lVar52 = auVar84._8_8_;
          auVar84._0_8_ = auVar84._0_8_ + lVar53;
          auVar84._8_8_ = lVar52 + lVar57;
          lVar52 = auVar82._8_8_;
          auVar82._0_8_ = auVar82._0_8_ + lVar53;
          auVar82._8_8_ = lVar52 + lVar57;
          lVar52 = auVar128._8_8_;
          auVar128._0_8_ = auVar128._0_8_ + lVar53;
          auVar128._8_8_ = lVar52 + lVar57;
          lVar52 = auVar113._8_8_;
          auVar113._0_8_ = auVar113._0_8_ + lVar53;
          auVar113._8_8_ = lVar52 + lVar57;
          pcVar51 = pcVar51 + 0x10;
          uVar50 = uVar50 - 0x10;
          auVar59 = _DAT_001471f0;
        } while (uVar50 != 0);
        pcVar51 = (this->data_)._M_t.
                  super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>
                  .super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl;
      }
      auVar49 = _DAT_00146060;
      if (iVar56 < iVar55) {
        uVar50 = (long)iVar54 + 0xfU & 0xfffffffffffffff0;
        lVar53 = (long)iVar54 + -1;
        auVar68._8_4_ = (int)lVar53;
        auVar68._0_8_ = lVar53;
        auVar68._12_4_ = (int)((ulong)lVar53 >> 0x20);
        pcVar51 = pcVar51 + 0xf;
        auVar59 = auVar68;
        auVar80 = _DAT_00147180;
        auVar81 = _DAT_00147190;
        auVar83 = _DAT_001471a0;
        auVar85 = _DAT_001471b0;
        auVar87 = _DAT_001471c0;
        auVar89 = _DAT_001471d0;
        auVar91 = _DAT_00146080;
        auVar93 = _DAT_00146050;
        do {
          auVar113 = auVar68 ^ auVar49;
          auVar128 = auVar93 ^ auVar49;
          iVar78 = auVar113._0_4_;
          iVar142 = -(uint)(iVar78 < auVar128._0_4_);
          iVar56 = auVar113._4_4_;
          auVar130._4_4_ = -(uint)(iVar56 < auVar128._4_4_);
          iVar54 = auVar113._8_4_;
          iVar150 = -(uint)(iVar54 < auVar128._8_4_);
          iVar79 = auVar113._12_4_;
          auVar130._12_4_ = -(uint)(iVar79 < auVar128._12_4_);
          auVar34._4_4_ = iVar142;
          auVar34._0_4_ = iVar142;
          auVar34._8_4_ = iVar150;
          auVar34._12_4_ = iVar150;
          auVar59 = pshuflw(auVar59,auVar34,0xe8);
          auVar129._4_4_ = -(uint)(auVar128._4_4_ == iVar56);
          auVar129._12_4_ = -(uint)(auVar128._12_4_ == iVar79);
          auVar129._0_4_ = auVar129._4_4_;
          auVar129._8_4_ = auVar129._12_4_;
          auVar128 = pshuflw(in_XMM11,auVar129,0xe8);
          auVar130._0_4_ = auVar130._4_4_;
          auVar130._8_4_ = auVar130._12_4_;
          auVar113 = pshuflw(auVar59,auVar130,0xe8);
          auVar69._8_4_ = 0xffffffff;
          auVar69._0_8_ = 0xffffffffffffffff;
          auVar69._12_4_ = 0xffffffff;
          auVar69 = (auVar113 | auVar128 & auVar59) ^ auVar69;
          auVar59 = packssdw(auVar69,auVar69);
          if ((auVar59 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pcVar51[-0xf].storage[0] = '\0';
          }
          auVar35._4_4_ = iVar142;
          auVar35._0_4_ = iVar142;
          auVar35._8_4_ = iVar150;
          auVar35._12_4_ = iVar150;
          auVar130 = auVar129 & auVar35 | auVar130;
          auVar59 = packssdw(auVar130,auVar130);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 ^ auVar11,auVar59 ^ auVar11);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59._0_4_ >> 8 & 1) != 0) {
            pcVar51[-0xe].storage[0] = '\0';
          }
          auVar59 = auVar91 ^ auVar49;
          auVar103._0_4_ = -(uint)(iVar78 < auVar59._0_4_);
          auVar103._4_4_ = -(uint)(iVar56 < auVar59._4_4_);
          auVar103._8_4_ = -(uint)(iVar54 < auVar59._8_4_);
          auVar103._12_4_ = -(uint)(iVar79 < auVar59._12_4_);
          auVar131._4_4_ = auVar103._0_4_;
          auVar131._0_4_ = auVar103._0_4_;
          auVar131._8_4_ = auVar103._8_4_;
          auVar131._12_4_ = auVar103._8_4_;
          iVar142 = -(uint)(auVar59._4_4_ == iVar56);
          iVar150 = -(uint)(auVar59._12_4_ == iVar79);
          auVar36._4_4_ = iVar142;
          auVar36._0_4_ = iVar142;
          auVar36._8_4_ = iVar150;
          auVar36._12_4_ = iVar150;
          auVar146._4_4_ = auVar103._4_4_;
          auVar146._0_4_ = auVar103._4_4_;
          auVar146._8_4_ = auVar103._12_4_;
          auVar146._12_4_ = auVar103._12_4_;
          auVar59 = auVar36 & auVar131 | auVar146;
          auVar59 = packssdw(auVar59,auVar59);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 ^ auVar12,auVar59 ^ auVar12);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59._0_4_ >> 0x10 & 1) != 0) {
            pcVar51[-0xd].storage[0] = '\0';
          }
          auVar59 = pshufhw(auVar59,auVar131,0x84);
          auVar37._4_4_ = iVar142;
          auVar37._0_4_ = iVar142;
          auVar37._8_4_ = iVar150;
          auVar37._12_4_ = iVar150;
          auVar128 = pshufhw(auVar103,auVar37,0x84);
          auVar113 = pshufhw(auVar59,auVar146,0x84);
          auVar70._8_4_ = 0xffffffff;
          auVar70._0_8_ = 0xffffffffffffffff;
          auVar70._12_4_ = 0xffffffff;
          auVar70 = (auVar113 | auVar128 & auVar59) ^ auVar70;
          auVar59 = packssdw(auVar70,auVar70);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59._0_4_ >> 0x18 & 1) != 0) {
            pcVar51[-0xc].storage[0] = '\0';
          }
          auVar59 = auVar89 ^ auVar49;
          auVar104._0_4_ = -(uint)(iVar78 < auVar59._0_4_);
          auVar104._4_4_ = -(uint)(iVar56 < auVar59._4_4_);
          auVar104._8_4_ = -(uint)(iVar54 < auVar59._8_4_);
          auVar104._12_4_ = -(uint)(iVar79 < auVar59._12_4_);
          auVar38._4_4_ = auVar104._0_4_;
          auVar38._0_4_ = auVar104._0_4_;
          auVar38._8_4_ = auVar104._8_4_;
          auVar38._12_4_ = auVar104._8_4_;
          auVar128 = pshuflw(auVar146,auVar38,0xe8);
          auVar71._0_4_ = -(uint)(auVar59._0_4_ == iVar78);
          auVar71._4_4_ = -(uint)(auVar59._4_4_ == iVar56);
          auVar71._8_4_ = -(uint)(auVar59._8_4_ == iVar54);
          auVar71._12_4_ = -(uint)(auVar59._12_4_ == iVar79);
          auVar132._4_4_ = auVar71._4_4_;
          auVar132._0_4_ = auVar71._4_4_;
          auVar132._8_4_ = auVar71._12_4_;
          auVar132._12_4_ = auVar71._12_4_;
          auVar59 = pshuflw(auVar71,auVar132,0xe8);
          auVar133._4_4_ = auVar104._4_4_;
          auVar133._0_4_ = auVar104._4_4_;
          auVar133._8_4_ = auVar104._12_4_;
          auVar133._12_4_ = auVar104._12_4_;
          auVar113 = pshuflw(auVar104,auVar133,0xe8);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 & auVar128,(auVar113 | auVar59 & auVar128) ^ auVar13);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pcVar51[-0xb].storage[0] = '\0';
          }
          auVar39._4_4_ = auVar104._0_4_;
          auVar39._0_4_ = auVar104._0_4_;
          auVar39._8_4_ = auVar104._8_4_;
          auVar39._12_4_ = auVar104._8_4_;
          auVar133 = auVar132 & auVar39 | auVar133;
          auVar113 = packssdw(auVar133,auVar133);
          auVar14._8_4_ = 0xffffffff;
          auVar14._0_8_ = 0xffffffffffffffff;
          auVar14._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59,auVar113 ^ auVar14);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59._4_2_ >> 8 & 1) != 0) {
            pcVar51[-10].storage[0] = '\0';
          }
          auVar59 = auVar87 ^ auVar49;
          auVar105._0_4_ = -(uint)(iVar78 < auVar59._0_4_);
          auVar105._4_4_ = -(uint)(iVar56 < auVar59._4_4_);
          auVar105._8_4_ = -(uint)(iVar54 < auVar59._8_4_);
          auVar105._12_4_ = -(uint)(iVar79 < auVar59._12_4_);
          auVar134._4_4_ = auVar105._0_4_;
          auVar134._0_4_ = auVar105._0_4_;
          auVar134._8_4_ = auVar105._8_4_;
          auVar134._12_4_ = auVar105._8_4_;
          iVar142 = -(uint)(auVar59._4_4_ == iVar56);
          iVar150 = -(uint)(auVar59._12_4_ == iVar79);
          auVar40._4_4_ = iVar142;
          auVar40._0_4_ = iVar142;
          auVar40._8_4_ = iVar150;
          auVar40._12_4_ = iVar150;
          auVar147._4_4_ = auVar105._4_4_;
          auVar147._0_4_ = auVar105._4_4_;
          auVar147._8_4_ = auVar105._12_4_;
          auVar147._12_4_ = auVar105._12_4_;
          auVar59 = auVar40 & auVar134 | auVar147;
          auVar59 = packssdw(auVar59,auVar59);
          auVar15._8_4_ = 0xffffffff;
          auVar15._0_8_ = 0xffffffffffffffff;
          auVar15._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 ^ auVar15,auVar59 ^ auVar15);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pcVar51[-9].storage[0] = '\0';
          }
          auVar59 = pshufhw(auVar59,auVar134,0x84);
          auVar41._4_4_ = iVar142;
          auVar41._0_4_ = iVar142;
          auVar41._8_4_ = iVar150;
          auVar41._12_4_ = iVar150;
          auVar128 = pshufhw(auVar105,auVar41,0x84);
          auVar113 = pshufhw(auVar59,auVar147,0x84);
          auVar72._8_4_ = 0xffffffff;
          auVar72._0_8_ = 0xffffffffffffffff;
          auVar72._12_4_ = 0xffffffff;
          auVar72 = (auVar113 | auVar128 & auVar59) ^ auVar72;
          auVar59 = packssdw(auVar72,auVar72);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59._6_2_ >> 8 & 1) != 0) {
            pcVar51[-8].storage[0] = '\0';
          }
          auVar59 = auVar85 ^ auVar49;
          auVar106._0_4_ = -(uint)(iVar78 < auVar59._0_4_);
          auVar106._4_4_ = -(uint)(iVar56 < auVar59._4_4_);
          auVar106._8_4_ = -(uint)(iVar54 < auVar59._8_4_);
          auVar106._12_4_ = -(uint)(iVar79 < auVar59._12_4_);
          auVar42._4_4_ = auVar106._0_4_;
          auVar42._0_4_ = auVar106._0_4_;
          auVar42._8_4_ = auVar106._8_4_;
          auVar42._12_4_ = auVar106._8_4_;
          auVar128 = pshuflw(auVar147,auVar42,0xe8);
          auVar73._0_4_ = -(uint)(auVar59._0_4_ == iVar78);
          auVar73._4_4_ = -(uint)(auVar59._4_4_ == iVar56);
          auVar73._8_4_ = -(uint)(auVar59._8_4_ == iVar54);
          auVar73._12_4_ = -(uint)(auVar59._12_4_ == iVar79);
          auVar135._4_4_ = auVar73._4_4_;
          auVar135._0_4_ = auVar73._4_4_;
          auVar135._8_4_ = auVar73._12_4_;
          auVar135._12_4_ = auVar73._12_4_;
          auVar59 = pshuflw(auVar73,auVar135,0xe8);
          auVar136._4_4_ = auVar106._4_4_;
          auVar136._0_4_ = auVar106._4_4_;
          auVar136._8_4_ = auVar106._12_4_;
          auVar136._12_4_ = auVar106._12_4_;
          auVar113 = pshuflw(auVar106,auVar136,0xe8);
          auVar107._8_4_ = 0xffffffff;
          auVar107._0_8_ = 0xffffffffffffffff;
          auVar107._12_4_ = 0xffffffff;
          auVar107 = (auVar113 | auVar59 & auVar128) ^ auVar107;
          auVar113 = packssdw(auVar107,auVar107);
          auVar59 = packsswb(auVar59 & auVar128,auVar113);
          if ((auVar59 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pcVar51[-7].storage[0] = '\0';
          }
          auVar43._4_4_ = auVar106._0_4_;
          auVar43._0_4_ = auVar106._0_4_;
          auVar43._8_4_ = auVar106._8_4_;
          auVar43._12_4_ = auVar106._8_4_;
          auVar136 = auVar135 & auVar43 | auVar136;
          auVar113 = packssdw(auVar136,auVar136);
          auVar16._8_4_ = 0xffffffff;
          auVar16._0_8_ = 0xffffffffffffffff;
          auVar16._12_4_ = 0xffffffff;
          auVar113 = packssdw(auVar113 ^ auVar16,auVar113 ^ auVar16);
          auVar59 = packsswb(auVar59,auVar113);
          if ((auVar59._8_2_ >> 8 & 1) != 0) {
            pcVar51[-6].storage[0] = '\0';
          }
          auVar59 = auVar83 ^ auVar49;
          auVar108._0_4_ = -(uint)(iVar78 < auVar59._0_4_);
          auVar108._4_4_ = -(uint)(iVar56 < auVar59._4_4_);
          auVar108._8_4_ = -(uint)(iVar54 < auVar59._8_4_);
          auVar108._12_4_ = -(uint)(iVar79 < auVar59._12_4_);
          auVar137._4_4_ = auVar108._0_4_;
          auVar137._0_4_ = auVar108._0_4_;
          auVar137._8_4_ = auVar108._8_4_;
          auVar137._12_4_ = auVar108._8_4_;
          iVar142 = -(uint)(auVar59._4_4_ == iVar56);
          iVar150 = -(uint)(auVar59._12_4_ == iVar79);
          auVar44._4_4_ = iVar142;
          auVar44._0_4_ = iVar142;
          auVar44._8_4_ = iVar150;
          auVar44._12_4_ = iVar150;
          auVar148._4_4_ = auVar108._4_4_;
          auVar148._0_4_ = auVar108._4_4_;
          auVar148._8_4_ = auVar108._12_4_;
          auVar148._12_4_ = auVar108._12_4_;
          auVar59 = auVar44 & auVar137 | auVar148;
          auVar59 = packssdw(auVar59,auVar59);
          auVar17._8_4_ = 0xffffffff;
          auVar17._0_8_ = 0xffffffffffffffff;
          auVar17._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 ^ auVar17,auVar59 ^ auVar17);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            pcVar51[-5].storage[0] = '\0';
          }
          auVar59 = pshufhw(auVar59,auVar137,0x84);
          auVar45._4_4_ = iVar142;
          auVar45._0_4_ = iVar142;
          auVar45._8_4_ = iVar150;
          auVar45._12_4_ = iVar150;
          auVar128 = pshufhw(auVar108,auVar45,0x84);
          auVar113 = pshufhw(auVar59,auVar148,0x84);
          auVar74._8_4_ = 0xffffffff;
          auVar74._0_8_ = 0xffffffffffffffff;
          auVar74._12_4_ = 0xffffffff;
          auVar74 = (auVar113 | auVar128 & auVar59) ^ auVar74;
          auVar59 = packssdw(auVar74,auVar74);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59._10_2_ >> 8 & 1) != 0) {
            pcVar51[-4].storage[0] = '\0';
          }
          auVar59 = auVar81 ^ auVar49;
          auVar109._0_4_ = -(uint)(iVar78 < auVar59._0_4_);
          auVar109._4_4_ = -(uint)(iVar56 < auVar59._4_4_);
          auVar109._8_4_ = -(uint)(iVar54 < auVar59._8_4_);
          auVar109._12_4_ = -(uint)(iVar79 < auVar59._12_4_);
          auVar46._4_4_ = auVar109._0_4_;
          auVar46._0_4_ = auVar109._0_4_;
          auVar46._8_4_ = auVar109._8_4_;
          auVar46._12_4_ = auVar109._8_4_;
          auVar128 = pshuflw(auVar148,auVar46,0xe8);
          auVar75._0_4_ = -(uint)(auVar59._0_4_ == iVar78);
          auVar75._4_4_ = -(uint)(auVar59._4_4_ == iVar56);
          auVar75._8_4_ = -(uint)(auVar59._8_4_ == iVar54);
          auVar75._12_4_ = -(uint)(auVar59._12_4_ == iVar79);
          auVar138._4_4_ = auVar75._4_4_;
          auVar138._0_4_ = auVar75._4_4_;
          auVar138._8_4_ = auVar75._12_4_;
          auVar138._12_4_ = auVar75._12_4_;
          auVar59 = pshuflw(auVar75,auVar138,0xe8);
          auVar139._4_4_ = auVar109._4_4_;
          auVar139._0_4_ = auVar109._4_4_;
          auVar139._8_4_ = auVar109._12_4_;
          auVar139._12_4_ = auVar109._12_4_;
          auVar113 = pshuflw(auVar109,auVar139,0xe8);
          auVar18._8_4_ = 0xffffffff;
          auVar18._0_8_ = 0xffffffffffffffff;
          auVar18._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 & auVar128,(auVar113 | auVar59 & auVar128) ^ auVar18);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pcVar51[-3].storage[0] = '\0';
          }
          auVar47._4_4_ = auVar109._0_4_;
          auVar47._0_4_ = auVar109._0_4_;
          auVar47._8_4_ = auVar109._8_4_;
          auVar47._12_4_ = auVar109._8_4_;
          auVar139 = auVar138 & auVar47 | auVar139;
          auVar113 = packssdw(auVar139,auVar139);
          auVar19._8_4_ = 0xffffffff;
          auVar19._0_8_ = 0xffffffffffffffff;
          auVar19._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59,auVar113 ^ auVar19);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59._12_2_ >> 8 & 1) != 0) {
            pcVar51[-2].storage[0] = '\0';
          }
          auVar59 = auVar80 ^ auVar49;
          auVar110._0_4_ = -(uint)(iVar78 < auVar59._0_4_);
          auVar110._4_4_ = -(uint)(iVar56 < auVar59._4_4_);
          auVar110._8_4_ = -(uint)(iVar54 < auVar59._8_4_);
          auVar110._12_4_ = -(uint)(iVar79 < auVar59._12_4_);
          auVar140._4_4_ = auVar110._0_4_;
          auVar140._0_4_ = auVar110._0_4_;
          auVar140._8_4_ = auVar110._8_4_;
          auVar140._12_4_ = auVar110._8_4_;
          iVar78 = -(uint)(auVar59._4_4_ == iVar56);
          iVar56 = -(uint)(auVar59._12_4_ == iVar79);
          auVar114._4_4_ = iVar78;
          auVar114._0_4_ = iVar78;
          auVar114._8_4_ = iVar56;
          auVar114._12_4_ = iVar56;
          auVar76._4_4_ = auVar110._4_4_;
          auVar76._0_4_ = auVar110._4_4_;
          auVar76._8_4_ = auVar110._12_4_;
          auVar76._12_4_ = auVar110._12_4_;
          auVar76 = auVar114 & auVar140 | auVar76;
          auVar59 = packssdw(auVar76,auVar76);
          auVar20._8_4_ = 0xffffffff;
          auVar20._0_8_ = 0xffffffffffffffff;
          auVar20._12_4_ = 0xffffffff;
          auVar59 = packssdw(auVar59 ^ auVar20,auVar59 ^ auVar20);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pcVar51[-1].storage[0] = '\0';
          }
          auVar59 = pshufhw(auVar59,auVar140,0x84);
          auVar113 = pshufhw(auVar110,auVar114,0x84);
          in_XMM11 = auVar113 & auVar59;
          auVar48._4_4_ = auVar110._4_4_;
          auVar48._0_4_ = auVar110._4_4_;
          auVar48._8_4_ = auVar110._12_4_;
          auVar48._12_4_ = auVar110._12_4_;
          auVar59 = pshufhw(auVar59,auVar48,0x84);
          auVar77._8_4_ = 0xffffffff;
          auVar77._0_8_ = 0xffffffffffffffff;
          auVar77._12_4_ = 0xffffffff;
          auVar77 = (auVar59 | in_XMM11) ^ auVar77;
          auVar59 = packssdw(auVar77,auVar77);
          auVar59 = packsswb(auVar59,auVar59);
          if ((auVar59._14_2_ >> 8 & 1) != 0) {
            pcVar51->storage[0] = '\0';
          }
          lVar53 = (long)DAT_001471f0;
          lVar52 = auVar93._8_8_;
          auVar93._0_8_ = auVar93._0_8_ + lVar53;
          lVar57 = DAT_001471f0._8_8_;
          auVar93._8_8_ = lVar52 + lVar57;
          lVar52 = auVar91._8_8_;
          auVar91._0_8_ = auVar91._0_8_ + lVar53;
          auVar91._8_8_ = lVar52 + lVar57;
          lVar52 = auVar89._8_8_;
          auVar89._0_8_ = auVar89._0_8_ + lVar53;
          auVar89._8_8_ = lVar52 + lVar57;
          lVar52 = auVar87._8_8_;
          auVar87._0_8_ = auVar87._0_8_ + lVar53;
          auVar87._8_8_ = lVar52 + lVar57;
          lVar52 = auVar85._8_8_;
          auVar85._0_8_ = auVar85._0_8_ + lVar53;
          auVar85._8_8_ = lVar52 + lVar57;
          lVar52 = auVar83._8_8_;
          auVar83._0_8_ = auVar83._0_8_ + lVar53;
          auVar83._8_8_ = lVar52 + lVar57;
          lVar52 = auVar81._8_8_;
          auVar81._0_8_ = auVar81._0_8_ + lVar53;
          auVar81._8_8_ = lVar52 + lVar57;
          lVar52 = auVar80._8_8_;
          auVar80._0_8_ = auVar80._0_8_ + lVar53;
          auVar80._8_8_ = lVar52 + lVar57;
          pcVar51 = pcVar51 + 0x10;
          uVar50 = uVar50 - 0x10;
          auVar59 = _DAT_001471f0;
        } while (uVar50 != 0);
      }
    }
    else {
      if (iVar78 != 0) {
        lVar52 = 0;
        lVar57 = lVar53;
        do {
          memcpy(pcVar51[(int)uVar1].storage + lVar52,elements->storage + lVar52,0x100);
          lVar52 = lVar52 + 0x100;
          lVar57 = lVar57 + -1;
        } while (lVar57 != 0);
        pcVar51 = (this->data_)._M_t.
                  super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>
                  .super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl;
      }
      if (iVar56 < iVar55) {
        lVar52 = -(long)iVar54;
        lVar57 = 0;
        do {
          memcpy(pcVar51->storage + lVar57,elements[lVar53].storage + lVar57,0x100);
          lVar57 = lVar57 + 0x100;
          lVar52 = lVar52 + 1;
        } while (lVar52 != 0);
      }
    }
    (this->write_index_).super___atomic_base<int>._M_i = (int)(uVar1 + iVar55) % this->capacity_;
  }
  return iVar55;
}

Assistant:

int enqueue(T * elements, int count)
  {
#ifndef NDEBUG
    assert_correct_thread(producer_id);
#endif

    int rd_idx = read_index_.load(std::memory_order_relaxed);
    int wr_idx = write_index_.load(std::memory_order_relaxed);

    if (full_internal(rd_idx, wr_idx)) {
      return 0;
    }

    int to_write =
      std::min(available_write_internal(rd_idx, wr_idx), count);

    /* First part, from the write index to the end of the array. */
    int first_part = std::min(storage_capacity() - wr_idx,
                                          to_write);
    /* Second part, from the beginning of the array */
    int second_part = to_write - first_part;

    if (elements) {
      Copy(data_.get() + wr_idx, elements, first_part);
      Copy(data_.get(), elements + first_part, second_part);
    } else {
      ConstructDefault(data_.get() + wr_idx, first_part);
      ConstructDefault(data_.get(), second_part);
    }

    write_index_.store(increment_index(wr_idx, to_write), std::memory_order_release);

    return to_write;
  }